

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O1

string * __thiscall
absl::strings_internal::CatPieces_abi_cxx11_
          (string *__return_storage_ptr__,strings_internal *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  pointer pcVar1;
  size_t __n;
  long lVar2;
  iterator pbVar3;
  char cVar4;
  pointer __dest;
  size_t this_size;
  long lVar5;
  
  pbVar3 = pieces._M_array;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pbVar3 == (iterator)0x0) {
    cVar4 = '\0';
  }
  else {
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + *(long *)(this + lVar2);
      cVar4 = (char)lVar5;
      lVar2 = lVar2 + 0x10;
    } while ((long)pbVar3 << 4 != lVar2);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar4);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  __dest = pcVar1;
  if (pbVar3 != (iterator)0x0) {
    lVar2 = 0;
    do {
      __n = *(size_t *)(this + lVar2);
      if (__n != 0) {
        memcpy(__dest,*(void **)(this + lVar2 + 8),__n);
        __dest = __dest + __n;
      }
      lVar2 = lVar2 + 0x10;
    } while ((long)pbVar3 << 4 != lVar2);
  }
  if (__dest != pcVar1 + __return_storage_ptr__->_M_string_length) {
    __assert_fail("out == begin + result.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0x95,
                  "std::string absl::strings_internal::CatPieces(std::initializer_list<absl::string_view>)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CatPieces(std::initializer_list<absl::string_view> pieces) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  uint64_t total_size = 0;
  for (absl::string_view piece : pieces) {
    total_size += piece.size();
  }
  ABSL_INTERNAL_CHECK(total_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(total_size));

  char* const begin = &result[0];
  char* out = begin;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + result.size());
  return result;
}